

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cpp
# Opt level: O2

void __thiscall
PythonGenerator::stdVectorToString
          (PythonGenerator *this,vector<double,_std::allocator<double>_> *toConvert,string *result)

{
  uint uVar1;
  reference pvVar2;
  ulong uVar3;
  size_type __n;
  string num2str;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (int)((ulong)((long)(toConvert->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(toConvert->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  __n = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != __n; __n = __n + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(toConvert,__n);
    doubleToString_abi_cxx11_(&local_70,*pvVar2);
    std::operator+(&local_50,&local_70,",");
    std::__cxx11::string::append((string *)result);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::at(toConvert,(long)(int)uVar1);
  doubleToString_abi_cxx11_(&local_70,*pvVar2);
  std::__cxx11::string::append((string *)result);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void PythonGenerator::stdVectorToString(std::vector<double> toConvert, std::string& result)
{
    int toConvertSize = toConvert.size();
    for(int i = 0; i < toConvertSize - 1; i++)
    {
        std::string num2str = doubleToString(toConvert.at(i));
        result += num2str + ",";
    }
    std::string num2str = doubleToString(toConvert.at(toConvertSize - 1));
    result += num2str;
}